

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_encoder.c
# Opt level: O2

HPDF_STATUS AddCidRainge(HPDF_MMgr mmgr,HPDF_CidRange_Rec range,HPDF_List target)

{
  HPDF_UINT16 *item;
  HPDF_STATUS HVar1;
  
  item = (HPDF_UINT16 *)HPDF_GetMem(mmgr,6);
  if (item == (HPDF_UINT16 *)0x0) {
    HVar1 = mmgr->error->error_no;
  }
  else {
    *item = range.from;
    item[1] = range.to;
    item[2] = range.cid;
    HVar1 = HPDF_List_Add(target,item);
    if (HVar1 == 0) {
      HVar1 = 0;
    }
    else {
      HPDF_FreeMem(mmgr,item);
    }
  }
  return HVar1;
}

Assistant:

static HPDF_STATUS
AddCidRainge  (HPDF_MMgr            mmgr,
               HPDF_CidRange_Rec    range,
               HPDF_List            target)
{
    HPDF_CidRange_Rec *prange;
    HPDF_STATUS ret;

    prange = HPDF_GetMem (mmgr, sizeof(HPDF_CidRange_Rec));
    if (!prange)
        return mmgr->error->error_no;

    prange->from = range.from;
    prange->to = range.to;
    prange->cid = range.cid;

    if ((ret = HPDF_List_Add (target, prange))
                != HPDF_OK) {
        HPDF_FreeMem (mmgr, prange);
        return ret;
    }

    return HPDF_OK;
}